

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void point_legacy2edwards(pt_prj_t_conflict4 *Q,pt_aff_t_conflict4 *P)

{
  uint64_t *out1;
  uint64_t *in_RSI;
  long in_RDI;
  limb_t *Z3;
  limb_t *T3;
  limb_t *Y3;
  limb_t *X3;
  limb_t *Y1;
  limb_t *X1;
  limb_t *S;
  limb_t *T;
  uint64_t *in_stack_000005c8;
  uint64_t *in_stack_000005d0;
  uint64_t *in_stack_00000b90;
  uint64_t *in_stack_00000b98;
  uint64_t *in_stack_00000ba0;
  uint64_t *arg1;
  
  arg1 = in_RSI + 10;
  out1 = (uint64_t *)(in_RDI + 0xa0);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1,in_RSI,const_T);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RSI,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_add((uint64_t *)(in_RDI + 0x50),out1,const_S);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RSI,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_sub(out1,out1,const_S);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry(in_RSI,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul
            (in_stack_00000ba0,in_stack_00000b98,in_stack_00000b90);
  fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(in_stack_000005d0,in_stack_000005c8);
  return;
}

Assistant:

static void point_legacy2edwards(pt_prj_t *Q, const pt_aff_t *P) {
    /* constants */
    const limb_t *T = const_T;
    const limb_t *S = const_S;
    const limb_t *X1 = P->X;
    const limb_t *Y1 = P->Y;
    limb_t *X3 = Q->X;
    limb_t *Y3 = Q->Y;
    limb_t *T3 = Q->T;
    limb_t *Z3 = Q->Z;

    /* the curve arith formula */
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(T3, X1, T);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_add(Y3, T3, S);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(X3, T3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Z3, Y1, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_sub(T3, T3, S);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Y3, Y1, T3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(T3, X3, Y3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(X3, X3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_mul(Y3, Y3, Z3);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_carry_square(Z3, Z3);
}